

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QLine>::emplace<QLine>(QPodArrayOps<QLine> *this,qsizetype i,QLine *args)

{
  QLine **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QPoint QVar5;
  QPoint QVar6;
  QLine *pQVar7;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QLine>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_003c35f9:
    QVar5 = args->pt1;
    QVar6 = args->pt2;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QLine>).size != 0);
    QArrayDataPointer<QLine>::detachAndGrow
              (&this->super_QArrayDataPointer<QLine>,where,1,(QLine **)0x0,
               (QArrayDataPointer<QLine> *)0x0);
    pQVar7 = createHole(this,where,i,1);
    pQVar7->pt1 = QVar5;
    pQVar7->pt2 = QVar6;
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QLine>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<QLine>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
        lVar4)) {
      QVar5 = args->pt2;
      pQVar7 = (this->super_QArrayDataPointer<QLine>).ptr + lVar4;
      pQVar7->pt1 = args->pt1;
      pQVar7->pt2 = QVar5;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QLine *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QLine>).ptr)) goto LAB_003c35f9;
      pQVar7 = (this->super_QArrayDataPointer<QLine>).ptr;
      QVar5 = args->pt2;
      pQVar7[-1].pt1 = args->pt1;
      pQVar7[-1].pt2 = QVar5;
      ppQVar1 = &(this->super_QArrayDataPointer<QLine>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QLine>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }